

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O1

void lysc_deviation_free(ly_ctx *ctx,lysc_deviation *dev)

{
  if (dev != (lysc_deviation *)0x0) {
    lysc_nodeid_free(ctx,dev->nodeid);
    if (dev->devs != (lysp_deviation **)0x0) {
      free(dev->devs + -1);
    }
    if (dev->dev_pmods != (lysp_module **)0x0) {
      free(dev->dev_pmods + -1);
    }
    free(dev);
    return;
  }
  return;
}

Assistant:

void
lysc_deviation_free(const struct ly_ctx *ctx, struct lysc_deviation *dev)
{
    if (!dev) {
        return;
    }

    lysc_nodeid_free(ctx, dev->nodeid);
    LY_ARRAY_FREE(dev->devs);
    LY_ARRAY_FREE(dev->dev_pmods);
    free(dev);
}